

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

bool clip_encode_float_image(clip_ctx *ctx,int n_threads,float *img,int h,int w,float *vec)

{
  value_type vVar1;
  reference pvVar2;
  int in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  clip_image_f32 *in_RDI;
  int in_R8D;
  int unaff_retaddr;
  clip_ctx *in_stack_00000008;
  int i;
  clip_image_f32 clip_img;
  int local_58;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff0;
  
  clip_image_f32::clip_image_f32((clip_image_f32 *)0x1af09a);
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  for (local_58 = 0; SBORROW4(local_58,in_ECX * in_R8D * 3) != local_58 + in_ECX * in_R8D * -3 < 0;
      local_58 = local_58 + 1) {
    vVar1 = *(value_type *)(in_RDX + (long)local_58 * 4);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffffc0,
                        (long)local_58);
    *pvVar2 = vVar1;
  }
  clip_image_encode(in_stack_00000008,unaff_retaddr,in_RDI,
                    (float *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  clip_image_f32::~clip_image_f32((clip_image_f32 *)0x1af162);
  return true;
}

Assistant:

bool clip_encode_float_image (struct clip_ctx * ctx, int n_threads, float * img, int h, int w, float * vec) {
    clip_image_f32 clip_img;
    clip_img.buf.resize(h * w * 3);
    for (int i = 0; i < h*w*3; i++)
    {
        clip_img.buf[i] = img[i];
    }
    clip_img.nx = w;
    clip_img.ny = h;
    clip_image_encode(ctx, n_threads, &clip_img, vec);
    return true;
}